

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_vector.cpp
# Opt level: O1

bool fill_review(Review *r)

{
  char cVar1;
  int iVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nEnter book title (q to quit): ",0x1f);
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '(');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)r,cVar1);
  iVar2 = std::__cxx11::string::compare((char *)r);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Enter book rating: ",0x13);
    std::istream::operator>>((istream *)&std::cin,&r->rating);
    if (((byte)cos[*(long *)(std::cin + -0x18)] & 5) == 0) {
      do {
        iVar2 = std::istream::get();
      } while (iVar2 != 10);
      return true;
    }
  }
  return false;
}

Assistant:

bool fill_review(Review & r) {
    std::cout << "\nEnter book title (q to quit): ";
    std::getline(std::cin, r.title);
    if (r.title == "q") {
        return false;
    }
    std::cout << "Enter book rating: ";
    std::cin >> r.rating;

    if (!std::cin) {
        return false;
    }
    //  get rid of rest of input line
    while(std::cin.get() != '\n') {
        continue;
    }
    return true;
}